

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_file.cpp
# Opt level: O0

HANDLE CreateFileA(LPCSTR lpFileName,DWORD dwDesiredAccess,DWORD dwShareMode,
                  LPSECURITY_ATTRIBUTES lpSecurityAttributes,DWORD dwCreationDisposition,
                  DWORD dwFlagsAndAttributes,HANDLE hTemplateFile)

{
  undefined1 *local_40;
  HANDLE hRet;
  CPalThread *pCStack_30;
  PAL_ERROR palError;
  CPalThread *pThread;
  DWORD dwFlagsAndAttributes_local;
  DWORD dwCreationDisposition_local;
  LPSECURITY_ATTRIBUTES lpSecurityAttributes_local;
  DWORD dwShareMode_local;
  DWORD dwDesiredAccess_local;
  LPCSTR lpFileName_local;
  
  hRet._4_4_ = 0;
  local_40 = &DAT_ffffffffffffffff;
  pThread._0_4_ = dwFlagsAndAttributes;
  pThread._4_4_ = dwCreationDisposition;
  _dwFlagsAndAttributes_local = lpSecurityAttributes;
  lpSecurityAttributes_local._0_4_ = dwShareMode;
  lpSecurityAttributes_local._4_4_ = dwDesiredAccess;
  _dwShareMode_local = lpFileName;
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  pCStack_30 = CorUnix::InternalGetCurrentThread();
  hRet._4_4_ = CorUnix::InternalCreateFile
                         (pCStack_30,_dwShareMode_local,lpSecurityAttributes_local._4_4_,
                          (DWORD)lpSecurityAttributes_local,_dwFlagsAndAttributes_local,
                          pThread._4_4_,(DWORD)pThread,hTemplateFile,&local_40);
  CorUnix::CPalThread::SetLastError(hRet._4_4_);
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    return local_40;
  }
  abort();
}

Assistant:

HANDLE
PALAPI
CreateFileA(
        IN LPCSTR lpFileName,
        IN DWORD dwDesiredAccess,
        IN DWORD dwShareMode,
        IN LPSECURITY_ATTRIBUTES lpSecurityAttributes,
        IN DWORD dwCreationDisposition,
        IN DWORD dwFlagsAndAttributes,
        IN HANDLE hTemplateFile
        )
{
    CPalThread *pThread;
    PAL_ERROR palError = NO_ERROR;
    HANDLE  hRet = INVALID_HANDLE_VALUE;

    PERF_ENTRY(CreateFileA);
    ENTRY("CreateFileA(lpFileName=%p (%s), dwAccess=%#x, dwShareMode=%#x, "
          "lpSecurityAttr=%p, dwDisposition=%#x, dwFlags=%#x, " 
          "hTemplateFile=%p )\n",lpFileName?lpFileName:"NULL",lpFileName?lpFileName:"NULL", dwDesiredAccess, 
          dwShareMode, lpSecurityAttributes, dwCreationDisposition, 
          dwFlagsAndAttributes, hTemplateFile);

    pThread = InternalGetCurrentThread();

    palError = InternalCreateFile(
        pThread,
        lpFileName,
        dwDesiredAccess,
        dwShareMode,
        lpSecurityAttributes,
        dwCreationDisposition,
        dwFlagsAndAttributes,
        hTemplateFile,
        &hRet
        );

    //
    // We always need to set last error, even on success:
    // we need to protect ourselves from the situation
    // where last error is set to ERROR_ALREADY_EXISTS on
    // entry to the function
    //

    pThread->SetLastError(palError);

    LOGEXIT("CreateFileA returns HANDLE %p\n", hRet);
    PERF_EXIT(CreateFileA);
    return hRet;
}